

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuMatrix.hpp
# Opt level: O2

Matrix<float,_1,_2> __thiscall
tcu::operator*(tcu *this,Matrix<float,_1,_2> *a,Matrix<float,_2,_2> *b)

{
  Matrix<float,_1,_2> MVar1;
  int col;
  long lVar2;
  int ndx;
  long lVar3;
  float v;
  float extraout_XMM0_Da [1];
  Vector<float,_1> VVar4;
  float extraout_XMM0_Db [1];
  Vector<float,_1> VVar5;
  
  Matrix<float,_1,_2>::Matrix((Matrix<float,_1,_2> *)this);
  VVar4.m_data[0] = (float  [1])(float  [1])extraout_XMM0_Da[0];
  VVar5.m_data[0] = (float  [1])(float  [1])extraout_XMM0_Db[0];
  for (lVar2 = 0; lVar2 != 2; lVar2 = lVar2 + 1) {
    VVar4.m_data[0] = (float  [1])0.0;
    VVar5.m_data[0] = (float  [1])0.0;
    for (lVar3 = 0; lVar3 != 2; lVar3 = lVar3 + 1) {
      VVar4.m_data[0] =
           (float  [1])
           ((float)VVar4.m_data[0] +
           (a->m_data).m_data[lVar3].m_data[0] *
           ((Vector<tcu::Vector<float,_2>,_2> *)((Vector<float,_2> *)b)->m_data)->m_data[0].m_data
           [lVar3]);
    }
    *(float (*) [1])(this + lVar2 * 4) = VVar4.m_data[0];
    b = (Matrix<float,_2,_2> *)((long)b + 8);
  }
  MVar1.m_data.m_data[1].m_data[0] = VVar5.m_data[0];
  MVar1.m_data.m_data[0].m_data[0] = VVar4.m_data[0];
  return (Matrix<float,_1,_2>)MVar1.m_data.m_data;
}

Assistant:

Matrix<T, Rows0, Cols1> operator* (const Matrix<T, Rows0, Cols0>& a, const Matrix<T, Rows1, Cols1>& b)
{
	DE_STATIC_ASSERT(Cols0 == Rows1);
	Matrix<T, Rows0, Cols1> res;
	for (int row = 0; row < Rows0; row++)
	{
		for (int col = 0; col < Cols1; col++)
		{
			T v = T(0);
			for (int ndx = 0; ndx < Cols0; ndx++)
				v += a(row,ndx) * b(ndx,col);
			res(row,col) = v;
		}
	}
	return res;
}